

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O0

void pipe_client_connect_cb(uv_connect_t *req,int status)

{
  int iVar1;
  undefined8 in_stack_fffffffffffffb20;
  undefined4 uVar2;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  char expected [19];
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  size_t sStack_440;
  int r;
  size_t len;
  char buf [1024];
  int status_local;
  uv_connect_t *req_local;
  
  uVar2 = (undefined4)((ulong)in_stack_fffffffffffffb20 >> 0x20);
  if (req != &connect_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-getsockname.c"
            ,0x36,"req","==","&connect_req",req,"==",&connect_req);
    abort();
  }
  if ((long)status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-getsockname.c"
            ,0x37,"status","==","0",(long)status,"==",0);
    abort();
  }
  sStack_440 = 0x400;
  iVar1 = uv_pipe_getpeername(&pipe_client,&len,&stack0xfffffffffffffbc0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-getsockname.c"
            ,0x3b,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((char)len == '\0') {
    eval_a_3 = 0x76752f706d742f00;
    builtin_strncpy(expected,"-test-sock",0xb);
    if (sStack_440 != 0x12) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-getsockname.c"
              ,0x3f,"len","==","sizeof(expected) - 1",sStack_440,"==",0x12);
      abort();
    }
    iVar1 = memcmp(&len,&eval_a_3,0x12);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%.*s %s %.*s)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-getsockname.c"
              ,0x40,"buf","==","expected",CONCAT44(uVar2,(int)sStack_440),&len,"==",(int)sStack_440,
              &eval_a_3);
      abort();
    }
  }
  else {
    if (*(char *)((long)&r + sStack_440 + 3) == '\0') {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-getsockname.c"
              ,0x42,"0","!=","buf[len - 1]",0,"!=",0);
      abort();
    }
    iVar1 = memcmp(&len,"/tmp/uv-test-sock",sStack_440);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%.*s %s %.*s)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-getsockname.c"
              ,0x43,"buf","==","\"/tmp/uv-test-sock\"",CONCAT44(uVar2,(int)sStack_440),&len,"==",
              (int)sStack_440,"/tmp/uv-test-sock");
      abort();
    }
  }
  sStack_440 = 0x400;
  iVar1 = uv_pipe_getsockname(&pipe_client,&len,&stack0xfffffffffffffbc0);
  if ((iVar1 == 0) && (sStack_440 == 0)) {
    pipe_client_connect_cb_called = pipe_client_connect_cb_called + 1;
    uv_close(&pipe_client,pipe_close_cb);
    uv_close(&pipe_server,pipe_close_cb);
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-getsockname.c"
          ,0x48,"r == 0 && len == 0");
  abort();
}

Assistant:

static void pipe_client_connect_cb(uv_connect_t* req, int status) {
  char buf[1024];
  size_t len;
  int r;

  ASSERT_PTR_EQ(req, &connect_req);
  ASSERT_OK(status);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT_OK(r);

  if (*buf == '\0') {  /* Linux abstract socket. */
    const char expected[] = "\0" TEST_PIPENAME;
    ASSERT_EQ(len, sizeof(expected) - 1);
    ASSERT_MEM_EQ(buf, expected, len);
  } else {
    ASSERT_NE(0, buf[len - 1]);
    ASSERT_MEM_EQ(buf, TEST_PIPENAME, len);
  }

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == 0 && len == 0);

  pipe_client_connect_cb_called++;

  uv_close((uv_handle_t*) &pipe_client, pipe_close_cb);
  uv_close((uv_handle_t*) &pipe_server, pipe_close_cb);
}